

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::ParseAddtlInfo_SnapRegexInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  int iVar1;
  uint32 uVar2;
  byte *pbVar3;
  TTDVar pvVar4;
  
  pbVar3 = SlabAllocatorBase<0>::SlabAllocateTypeRawSize<32ul>(alloc);
  (*reader->_vptr_FileReader[3])(reader,0x11,1);
  (*reader->_vptr_FileReader[0x13])(reader,alloc,pbVar3,0);
  (*reader->_vptr_FileReader[3])(reader,0x34,1);
  iVar1 = (*reader->_vptr_FileReader[0x12])(reader,0);
  pbVar3[0x10] = (byte)iVar1;
  uVar2 = FileReader::ReadUInt32(reader,u32Val,true);
  *(uint32 *)(pbVar3 + 0x14) = uVar2;
  (*reader->_vptr_FileReader[3])(reader,0x14,1);
  pvVar4 = NSSnapValues::ParseTTDVar(false,reader);
  *(TTDVar *)(pbVar3 + 0x18) = pvVar4;
  if (snpObject->SnapObjectTag == SnapRegexObject) {
    snpObject->AddtlSnapObjectInfo = pbVar3;
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void ParseAddtlInfo_SnapRegexInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapRegexInfo* regexInfo = alloc.SlabAllocateStruct<SnapRegexInfo>();

            reader->ReadString(NSTokens::Key::stringVal, alloc, regexInfo->RegexStr, true);

            regexInfo->Flags = reader->ReadTag<UnifiedRegex::RegexFlags>(NSTokens::Key::attributeFlags, true);
            regexInfo->LastIndexOrFlag = reader->ReadUInt32(NSTokens::Key::u32Val, true);

            reader->ReadKey(NSTokens::Key::ttdVarTag, true);
            regexInfo->LastIndexVar = NSSnapValues::ParseTTDVar(false, reader);

            SnapObjectSetAddtlInfoAs<SnapRegexInfo*, SnapObjectType::SnapRegexObject>(snpObject, regexInfo);
        }